

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O1

ClippedEdge * __thiscall MutableS2ShapeIndex::EdgeAllocator::NewClippedEdge(EdgeAllocator *this)

{
  pointer *ppuVar1;
  iterator __position;
  size_t sVar2;
  pointer puVar3;
  long lVar4;
  _Head_base<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_false> local_38;
  S2LogMessage local_30;
  
  __position._M_current =
       (this->clipped_edges_).
       super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (this->size_ ==
      (long)__position._M_current -
      (long)(this->clipped_edges_).
            super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    local_38._M_head_impl = (ClippedEdge *)operator_new(0x28);
    lVar4 = 0x10;
    do {
      *(undefined8 *)((long)((local_38._M_head_impl)->bound).bounds_ + lVar4 + 0xfffffffffffffff0U)
           = 0x3ff0000000000000;
      *(undefined8 *)((long)((local_38._M_head_impl)->bound).bounds_ + lVar4 + -8) = 0;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x30);
    if ((((R1Interval *)((long)((local_38._M_head_impl)->bound).bounds_ + 0x10))->bounds_).c_[0] <=
        *(VType *)((long)((local_38._M_head_impl)->bound).bounds_ + 0x18) ==
        *(VType *)((long)((local_38._M_head_impl)->bound).bounds_ + 8) <
        ((local_38._M_head_impl)->bound).bounds_[0].bounds_.c_[0]) {
      S2LogMessage::S2LogMessage
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/r2rect.h"
                 ,0xb1,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_30.stream_,"Check failed: is_valid() ",0x19);
      abort();
    }
    if (__position._M_current ==
        (this->clipped_edges_).
        super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>,std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>>>
      ::_M_realloc_insert<MutableS2ShapeIndex::ClippedEdge*>
                ((vector<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>,std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,std::default_delete<MutableS2ShapeIndex::ClippedEdge>>>>
                  *)&this->clipped_edges_,__position,&local_38._M_head_impl);
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
      ._M_t.
      super__Tuple_impl<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
      .super__Head_base<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_false>._M_head_impl =
           local_38._M_head_impl;
      ppuVar1 = &(this->clipped_edges_).
                 super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
  }
  sVar2 = this->size_;
  puVar3 = (this->clipped_edges_).
           super__Vector_base<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>,_std::allocator<std::unique_ptr<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this->size_ = sVar2 + 1;
  return (ClippedEdge *)
         ((_Tuple_impl<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
           )puVar3[sVar2]._M_t.
            super___uniq_ptr_impl<MutableS2ShapeIndex::ClippedEdge,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
            ._M_t).
         super__Tuple_impl<0UL,_MutableS2ShapeIndex::ClippedEdge_*,_std::default_delete<MutableS2ShapeIndex::ClippedEdge>_>
  ;
}

Assistant:

ClippedEdge* NewClippedEdge() {
    if (size_ == clipped_edges_.size()) {
      clipped_edges_.emplace_back(new ClippedEdge);
    }
    return clipped_edges_[size_++].get();
  }